

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O2

int refs_modify(refs_table_t *tbl,uint64_t a,int dir)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  ulong *puVar6;
  ulong *puVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  bool bVar12;
  
  uVar4 = ((a >> 0x27 | a << 0x19) ^ (a ^ 0xcbf29ce484222325) * 0x100000001b3) * 0x100000001b3;
LAB_00110058:
  do {
    while (uVar2 = tbl->refs_control, 0xfffffff < uVar2) {
      do {
        iVar8 = refs_resize_help(tbl);
      } while (iVar8 != 0);
    }
    LOCK();
    bVar12 = uVar2 == tbl->refs_control;
    if (bVar12) {
      tbl->refs_control = uVar2 + 1;
    }
    UNLOCK();
  } while (!bVar12);
  do {
    iVar8 = 0x80;
    puVar5 = (ulong *)0x0;
    puVar6 = tbl->refs_table + (tbl->refs_size - 1 & (uVar4 >> 0x20 ^ uVar4));
    while (bVar12 = iVar8 != 0, iVar8 = iVar8 + -1, bVar12) {
LAB_001100a5:
      uVar3 = *puVar6;
      if (uVar3 == 0) {
        if (dir < 0) goto LAB_00110236;
        uVar3 = 0x7fffffffffffffff;
        if (puVar5 == (ulong *)0x0) {
          uVar3 = 0;
          puVar5 = puVar6;
        }
        iVar11 = 0;
        puVar7 = (ulong *)0x0;
        puVar6 = puVar5;
        uVar9 = a | 0x10000000000;
LAB_00110110:
        LOCK();
        uVar1 = *puVar6;
        if (uVar3 == uVar1) {
          *puVar6 = uVar9;
        }
        UNLOCK();
        puVar5 = puVar7;
        if (uVar3 == uVar1) goto LAB_00110241;
        goto LAB_001100a5;
      }
      if (uVar3 != 0x7fffffffffffffff) {
        if ((uVar3 & 0xffffffffff) != a) goto LAB_00110123;
        if (uVar3 >> 0x28 == 0x7fffff) goto LAB_0011023b;
        lVar10 = (uVar3 >> 0x28) + (long)dir;
        uVar9 = lVar10 << 0x28 | a;
        if (lVar10 == 0) {
          uVar9 = 0x7fffffffffffffff;
        }
        iVar11 = 1;
        puVar7 = puVar5;
        goto LAB_00110110;
      }
      if (puVar5 == (ulong *)0x0) {
        puVar5 = puVar6;
      }
LAB_00110123:
      puVar6 = puVar6 + 1;
      if (puVar6 == tbl->refs_table + tbl->refs_size) {
        puVar6 = tbl->refs_table;
      }
    }
    if (dir < 0) {
LAB_00110236:
      iVar11 = 0;
      goto LAB_00110241;
    }
    if (puVar5 == (ulong *)0x0) break;
    LOCK();
    uVar3 = *puVar5;
    if (uVar3 == 0x7fffffffffffffff) {
      *puVar5 = a | 0x10000000000;
    }
    UNLOCK();
    if (uVar3 == 0x7fffffffffffffff) {
LAB_0011023b:
      iVar11 = 1;
LAB_00110241:
      refs_leave(tbl);
      return iVar11;
    }
  } while( true );
  refs_leave(tbl);
  while (uVar2 = tbl->refs_control, uVar2 < 0x10000000) {
    LOCK();
    bVar12 = uVar2 == tbl->refs_control;
    if (bVar12) {
      tbl->refs_control = uVar2 | 0x80000000;
    }
    UNLOCK();
    if (bVar12) {
      do {
      } while( true );
    }
  }
  do {
    iVar8 = refs_resize_help(tbl);
  } while (iVar8 != 0);
  goto LAB_00110058;
}

Assistant:

static inline int
refs_modify(refs_table_t *tbl, const uint64_t a, const int dir)
{
    _Atomic(uint64_t)* bucket;
    _Atomic(uint64_t)* ts_bucket;
    uint64_t v, new_v;
    int res, i;

    refs_enter(tbl);

ref_retry:
    bucket = tbl->refs_table + (fnvhash8(a) & (tbl->refs_size - 1));
    ts_bucket = NULL; // tombstone
    i = 128; // try 128 times linear probing

    while (i--) {
ref_restart:
        v = *bucket;
        if (v == refs_ts) {
            if (ts_bucket == NULL) ts_bucket = bucket;
        } else if (v == 0) {
            // not found
            res = 0;
            if (dir < 0) goto ref_exit;
            if (ts_bucket != NULL) {
                bucket = ts_bucket;
                ts_bucket = NULL;
                v = refs_ts;
            }
            new_v = a | (1ULL << 40);
            goto ref_mod;
        } else if ((v & 0x000000ffffffffff) == a) {
            // found
            res = 1;
            uint64_t count = v >> 40;
            if (count == 0x7fffff) goto ref_exit;
            count += dir;
            if (count == 0) new_v = refs_ts;
            else new_v = a | (count << 40);
            goto ref_mod;
        }

        if (++bucket == tbl->refs_table + tbl->refs_size) bucket = tbl->refs_table;
    }

    // not found after linear probing
    if (dir < 0) {
        res = 0;
        goto ref_exit;
    } else if (ts_bucket != NULL) {
        bucket = ts_bucket;
        ts_bucket = NULL;
        v = refs_ts;
        new_v = a | (1ULL << 40);
        if (!atomic_compare_exchange_weak(bucket, &v, new_v)) goto ref_retry;
        res = 1;
        goto ref_exit;
    } else {
        // hash table full
        refs_leave(tbl);
        refs_resize(tbl);
        return refs_modify(tbl, a, dir);
    }

ref_mod:
    if (!atomic_compare_exchange_weak(bucket, &v, new_v)) goto ref_restart;

ref_exit:
    refs_leave(tbl);
    return res;
}